

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_div_uvec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int i;
  long lVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Vector<unsigned_int,_4> res_2;
  Vector<unsigned_int,_4> res_1;
  Vector<unsigned_int,_4> res;
  
  fVar1 = c->in[0].m_data[0];
  fVar2 = c->in[0].m_data[1];
  fVar3 = c->in[0].m_data[2];
  fVar4 = c->in[0].m_data[3];
  iVar8 = (int)fVar1;
  iVar10 = (int)fVar2;
  iVar12 = (int)fVar3;
  iVar14 = (int)fVar4;
  auVar7._0_4_ = (int)(fVar1 - 2.1474836e+09);
  auVar7._4_4_ = (int)(fVar2 - 2.1474836e+09);
  auVar7._8_4_ = (int)(fVar3 - 2.1474836e+09);
  auVar7._12_4_ = (int)(fVar4 - 2.1474836e+09);
  auVar16._0_4_ = iVar8 >> 0x1f;
  auVar16._4_4_ = iVar10 >> 0x1f;
  auVar16._8_4_ = iVar12 >> 0x1f;
  auVar16._12_4_ = iVar14 >> 0x1f;
  auVar17._4_4_ = iVar10;
  auVar17._0_4_ = iVar8;
  auVar17._8_4_ = iVar12;
  auVar17._12_4_ = iVar14;
  auVar17 = auVar16 & auVar7 | auVar17;
  auVar6 = auVar17._4_12_;
  res.m_data[0] = auVar6._0_4_;
  res.m_data[1] = auVar6._4_4_;
  res.m_data[2] = auVar6._8_4_;
  res.m_data[3] = auVar17._0_4_;
  fVar1 = c->in[1].m_data[0];
  fVar2 = c->in[1].m_data[1];
  fVar3 = c->in[1].m_data[2];
  fVar4 = c->in[1].m_data[3];
  uVar9 = (uint)fVar1;
  uVar11 = (uint)fVar2;
  uVar13 = (uint)fVar3;
  uVar15 = (uint)fVar4;
  res_1.m_data[0] = (int)uVar15 >> 0x1f & (int)(fVar4 - 2.1474836e+09) | uVar15;
  res_1.m_data[1] = (int)uVar13 >> 0x1f & (int)(fVar3 - 2.1474836e+09) | uVar13;
  res_1.m_data[2] = (int)uVar11 >> 0x1f & (int)(fVar2 - 2.1474836e+09) | uVar11;
  res_1.m_data[3] = (int)uVar9 >> 0x1f & (int)(fVar1 - 2.1474836e+09) | uVar9;
  res_2.m_data[0] = 0;
  res_2.m_data[1] = 0;
  res_2.m_data[2] = 0;
  res_2.m_data[3] = 0;
  lVar5 = 0;
  do {
    res_2.m_data[lVar5] = res.m_data[lVar5] / res_1.m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  (c->color).m_data[0] =
       ((float)(res_2.m_data[0] >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(res_2.m_data[0] & 0xffff | 0x4b000000);
  (c->color).m_data[1] =
       ((float)(res_2.m_data[1] >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(res_2.m_data[1] & 0xffff | 0x4b000000);
  (c->color).m_data[2] =
       ((float)(res_2.m_data[2] >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(res_2.m_data[2] & 0xffff | 0x4b000000);
  (c->color).m_data[3] =
       ((float)(res_2.m_data[3] >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(res_2.m_data[3] & 0xffff | 0x4b000000);
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }